

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O0

int Cec_ManChoiceComputation_int(Gia_Man_t *pAig,Cec_ParChc_t *pPars)

{
  Vec_Int_t *pVVar1;
  Cec_ParChc_t *pCVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  abctime aVar7;
  abctime aVar8;
  Cec_ManSim_t *p;
  abctime aVar9;
  Gia_Man_t *p_00;
  abctime aVar10;
  long lVar11;
  abctime clk;
  abctime clk2;
  abctime clkTotal;
  abctime clkSrm;
  abctime clkSim;
  abctime clkSat;
  int RetValue;
  int r;
  Gia_Man_t *pSrm;
  Cec_ManSim_t *pSim;
  Cec_ParSat_t *pParsSat;
  Cec_ParSat_t ParsSat;
  Cec_ParSim_t *pParsSim;
  Cec_ParSim_t ParsSim;
  Vec_Int_t *vCexStore;
  Vec_Int_t *vOutputs;
  Vec_Str_t *vStatus;
  Cec_ParChc_t *pCStack_18;
  int nItersMax;
  Cec_ParChc_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  vStatus._4_4_ = 1000;
  ParsSat._28_8_ = &pParsSim;
  clkSim = 0;
  clkSrm = 0;
  clkTotal = 0;
  pCStack_18 = pPars;
  pPars_local = (Cec_ParChc_t *)pAig;
  aVar7 = Abc_Clock();
  aVar8 = Abc_Clock();
  if (*(long *)&pPars_local[6].fVerbose != 0) {
    free(*(void **)&pPars_local[6].fVerbose);
    *(undefined8 *)&pPars_local[6].fVerbose = 0;
  }
  lVar11._0_4_ = pPars_local[7].nRounds;
  lVar11._4_4_ = pPars_local[7].nBTLimit;
  if (lVar11 != 0) {
    free(*(void **)&pPars_local[7].nRounds);
    pPars_local[7].nRounds = 0;
    pPars_local[7].nBTLimit = 0;
  }
  Gia_ManRandom(1);
  Cec_ManSimSetDefaultParams((Cec_ParSim_t *)ParsSat._28_8_);
  *(int *)ParsSat._28_8_ = pCStack_18->nWords;
  *(int *)(ParsSat._28_8_ + 4) = pCStack_18->nRounds;
  *(int *)(ParsSat._28_8_ + 0x2c) = pCStack_18->fVerbose;
  *(undefined4 *)(ParsSat._28_8_ + 0x20) = 0;
  *(undefined4 *)(ParsSat._28_8_ + 0x1c) = 0;
  p = Cec_ManSimStart((Gia_Man_t *)pPars_local,(Cec_ParSim_t *)ParsSat._28_8_);
  Cec_ManSimClassesPrepare(p,-1);
  Cec_ManSimClassesRefine(p);
  Cec_ManSatSetDefaultParams((Cec_ParSat_t *)((long)&pParsSat + 4));
  pParsSat._4_4_ = pCStack_18->nBTLimit;
  ParsSat.fLearnCls = pCStack_18->fVerbose;
  if (pCStack_18->fVerbose != 0) {
    uVar3 = Gia_ManObjNum((Gia_Man_t *)pPars_local);
    uVar4 = Gia_ManAndNum((Gia_Man_t *)pPars_local);
    Abc_Print(1,"Obj = %7d. And = %7d. Conf = %5d. Ring = %d. CSat = %d.\n",(ulong)uVar3,
              (ulong)uVar4,(ulong)(uint)pCStack_18->nBTLimit,(ulong)(uint)pCStack_18->fUseRings,
              pCStack_18->fUseCSat);
    pCVar2 = pPars_local;
    aVar9 = Abc_Clock();
    Cec_ManRefinedClassPrintStats((Gia_Man_t *)pCVar2,(Vec_Str_t *)0x0,0,aVar9 - aVar8);
  }
  clkSat._4_4_ = 0;
  do {
    if (vStatus._4_4_ <= clkSat._4_4_) {
LAB_007e134d:
      if (clkSat._4_4_ == vStatus._4_4_) {
        Abc_Print(1,"The refinement was not finished. The result may be incorrect.\n");
      }
      Cec_ManSimStop(p);
      aVar8 = Abc_Clock();
      lVar11 = aVar8 - aVar7;
      if (pCStack_18->fVerbose != 0) {
        Abc_PrintTimeP(1,"Srm  ",clkTotal,lVar11);
        Abc_PrintTimeP(1,"Sat  ",clkSim,lVar11);
        Abc_PrintTimeP(1,"Sim  ",clkSrm,lVar11);
        Abc_PrintTimeP(1,"Other",((lVar11 - clkSim) - clkTotal) - clkSrm,lVar11);
        Abc_PrintTime(1,"TOTAL",lVar11);
      }
      return 0;
    }
    aVar8 = Abc_Clock();
    aVar9 = Abc_Clock();
    p_00 = Cec_ManCombSpecReduce((Gia_Man_t *)pPars_local,&vCexStore,pCStack_18->fUseRings);
    iVar5 = Gia_ManRegNum(p_00);
    if (iVar5 != 0) {
LAB_007e10c3:
      __assert_fail("Gia_ManRegNum(pSrm) == 0 && Gia_ManCiNum(pSrm) == Gia_ManCiNum(pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecChoice.c"
                    ,0xf5,"int Cec_ManChoiceComputation_int(Gia_Man_t *, Cec_ParChc_t *)");
    }
    iVar5 = Gia_ManCiNum(p_00);
    iVar6 = Gia_ManCiNum((Gia_Man_t *)pPars_local);
    if (iVar5 != iVar6) goto LAB_007e10c3;
    aVar10 = Abc_Clock();
    clkTotal = (aVar10 - aVar9) + clkTotal;
    iVar5 = Gia_ManCoNum(p_00);
    pCVar2 = pPars_local;
    if (iVar5 == 0) {
      if (pCStack_18->fVerbose != 0) {
        aVar9 = Abc_Clock();
        Cec_ManRefinedClassPrintStats
                  ((Gia_Man_t *)pCVar2,(Vec_Str_t *)0x0,clkSat._4_4_ + 1,aVar9 - aVar8);
      }
      Vec_IntFree(vCexStore);
      Gia_ManStop(p_00);
      goto LAB_007e134d;
    }
    aVar9 = Abc_Clock();
    if (pCStack_18->fUseCSat == 0) {
      ParsSim._40_8_ =
           Cec_ManSatSolveMiter(p_00,(Cec_ParSat_t *)((long)&pParsSat + 4),(Vec_Str_t **)&vOutputs);
    }
    else {
      ParsSim._40_8_ = Cbs_ManSolveMiterNc(p_00,pCStack_18->nBTLimit,(Vec_Str_t **)&vOutputs,0);
    }
    Gia_ManStop(p_00);
    aVar10 = Abc_Clock();
    clkSim = (aVar10 - aVar9) + clkSim;
    iVar5 = Vec_IntSize((Vec_Int_t *)ParsSim._40_8_);
    pCVar2 = pPars_local;
    pVVar1 = vOutputs;
    if (iVar5 == 0) {
      if (pCStack_18->fVerbose != 0) {
        aVar9 = Abc_Clock();
        Cec_ManRefinedClassPrintStats
                  ((Gia_Man_t *)pCVar2,(Vec_Str_t *)pVVar1,clkSat._4_4_ + 1,aVar9 - aVar8);
      }
      Vec_IntFree((Vec_Int_t *)ParsSim._40_8_);
      Vec_StrFree((Vec_Str_t *)vOutputs);
      Vec_IntFree(vCexStore);
      goto LAB_007e134d;
    }
    aVar9 = Abc_Clock();
    Cec_ManResimulateCounterExamplesComb(p,(Vec_Int_t *)ParsSim._40_8_);
    Vec_IntFree((Vec_Int_t *)ParsSim._40_8_);
    aVar10 = Abc_Clock();
    clkSrm = (aVar10 - aVar9) + clkSrm;
    Gia_ManCheckRefinements
              ((Gia_Man_t *)pPars_local,(Vec_Str_t *)vOutputs,vCexStore,p,pCStack_18->fUseRings);
    pCVar2 = pPars_local;
    pVVar1 = vOutputs;
    if (pCStack_18->fVerbose != 0) {
      aVar9 = Abc_Clock();
      Cec_ManRefinedClassPrintStats
                ((Gia_Man_t *)pCVar2,(Vec_Str_t *)pVVar1,clkSat._4_4_ + 1,aVar9 - aVar8);
    }
    Vec_StrFree((Vec_Str_t *)vOutputs);
    Vec_IntFree(vCexStore);
    clkSat._4_4_ = clkSat._4_4_ + 1;
  } while( true );
}

Assistant:

int Cec_ManChoiceComputation_int( Gia_Man_t * pAig, Cec_ParChc_t * pPars )
{
    int nItersMax = 1000;
    Vec_Str_t * vStatus;
    Vec_Int_t * vOutputs;
    Vec_Int_t * vCexStore;
    Cec_ParSim_t ParsSim, * pParsSim = &ParsSim;
    Cec_ParSat_t ParsSat, * pParsSat = &ParsSat;
    Cec_ManSim_t * pSim;
    Gia_Man_t * pSrm;
    int r, RetValue;
    abctime clkSat = 0, clkSim = 0, clkSrm = 0, clkTotal = Abc_Clock();
    abctime clk2, clk = Abc_Clock();
    ABC_FREE( pAig->pReprs );
    ABC_FREE( pAig->pNexts );
    Gia_ManRandom( 1 );
    // prepare simulation manager
    Cec_ManSimSetDefaultParams( pParsSim );
    pParsSim->nWords     = pPars->nWords;
    pParsSim->nFrames    = pPars->nRounds;
    pParsSim->fVerbose   = pPars->fVerbose;
    pParsSim->fLatchCorr   = 0;
    pParsSim->fSeqSimulate = 0;
    // create equivalence classes of registers
    pSim = Cec_ManSimStart( pAig, pParsSim );
    Cec_ManSimClassesPrepare( pSim, -1 );
    Cec_ManSimClassesRefine( pSim );
    // prepare SAT solving
    Cec_ManSatSetDefaultParams( pParsSat );
    pParsSat->nBTLimit = pPars->nBTLimit;
    pParsSat->fVerbose = pPars->fVerbose;
    if ( pPars->fVerbose )
    {
        Abc_Print( 1, "Obj = %7d. And = %7d. Conf = %5d. Ring = %d. CSat = %d.\n",
            Gia_ManObjNum(pAig), Gia_ManAndNum(pAig), pPars->nBTLimit, pPars->fUseRings, pPars->fUseCSat );
        Cec_ManRefinedClassPrintStats( pAig, NULL, 0, Abc_Clock() - clk );
    }
    // perform refinement of equivalence classes
    for ( r = 0; r < nItersMax; r++ )
    { 
        clk = Abc_Clock();
        // perform speculative reduction
        clk2 = Abc_Clock();
        pSrm = Cec_ManCombSpecReduce( pAig, &vOutputs, pPars->fUseRings );
        assert( Gia_ManRegNum(pSrm) == 0 && Gia_ManCiNum(pSrm) == Gia_ManCiNum(pAig) );
        clkSrm += Abc_Clock() - clk2;
        if ( Gia_ManCoNum(pSrm) == 0 )
        {
            if ( pPars->fVerbose )
                Cec_ManRefinedClassPrintStats( pAig, NULL, r+1, Abc_Clock() - clk );
            Vec_IntFree( vOutputs );
            Gia_ManStop( pSrm );            
            break;
        }
//Gia_DumpAiger( pSrm, "choicesrm", r, 2 );
        // found counter-examples to speculation
        clk2 = Abc_Clock();
        if ( pPars->fUseCSat )
            vCexStore = Cbs_ManSolveMiterNc( pSrm, pPars->nBTLimit, &vStatus, 0 );
        else
            vCexStore = Cec_ManSatSolveMiter( pSrm, pParsSat, &vStatus );
        Gia_ManStop( pSrm );
        clkSat += Abc_Clock() - clk2;
        if ( Vec_IntSize(vCexStore) == 0 )
        {
            if ( pPars->fVerbose )
                Cec_ManRefinedClassPrintStats( pAig, vStatus, r+1, Abc_Clock() - clk );
            Vec_IntFree( vCexStore );
            Vec_StrFree( vStatus );
            Vec_IntFree( vOutputs );
            break;
        }
        // refine classes with these counter-examples
        clk2 = Abc_Clock();
        RetValue = Cec_ManResimulateCounterExamplesComb( pSim, vCexStore );
        Vec_IntFree( vCexStore );
        clkSim += Abc_Clock() - clk2;
        Gia_ManCheckRefinements( pAig, vStatus, vOutputs, pSim, pPars->fUseRings );
        if ( pPars->fVerbose )
            Cec_ManRefinedClassPrintStats( pAig, vStatus, r+1, Abc_Clock() - clk );
        Vec_StrFree( vStatus );
        Vec_IntFree( vOutputs );
//Gia_ManEquivPrintClasses( pAig, 1, 0 );
    }
    // check the overflow
    if ( r == nItersMax )
        Abc_Print( 1, "The refinement was not finished. The result may be incorrect.\n" );
    Cec_ManSimStop( pSim );
    clkTotal = Abc_Clock() - clkTotal;
    // report the results
    if ( pPars->fVerbose )
    {
        Abc_PrintTimeP( 1, "Srm  ", clkSrm,                        clkTotal );
        Abc_PrintTimeP( 1, "Sat  ", clkSat,                        clkTotal );
        Abc_PrintTimeP( 1, "Sim  ", clkSim,                        clkTotal );
        Abc_PrintTimeP( 1, "Other", clkTotal-clkSat-clkSrm-clkSim, clkTotal );
        Abc_PrintTime( 1, "TOTAL",  clkTotal );
    }
    return 0;
}